

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_list.cpp
# Opt level: O0

vector<duckdb::LogicalType,_true> * __thiscall duckdb::ColumnList::GetColumnTypes(ColumnList *this)

{
  bool bVar1;
  reference this_00;
  value_type *in_RSI;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_RDI;
  ColumnDefinition *column;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::ColumnDefinition,_true> *__range1;
  vector<duckdb::LogicalType,_true> *types;
  vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
  *in_stack_ffffffffffffff98;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *this_01;
  __normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
  in_stack_ffffffffffffffc8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_stack_ffffffffffffffd0;
  
  this_01 = in_RDI;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x2a1347f);
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::size
            ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)in_RSI);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::reserve
            (in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8._M_current);
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::begin
            (in_stack_ffffffffffffff98);
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::end
            (in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::
                 operator!=<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
                           ((__normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
              ::operator*((__normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
                           *)&stack0xffffffffffffffc8);
    ColumnDefinition::Type(this_00);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (this_01,in_RSI);
    __gnu_cxx::
    __normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
    ::operator++((__normal_iterator<const_duckdb::ColumnDefinition_*,_std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>_>
                  *)&stack0xffffffffffffffc8);
  }
  return (vector<duckdb::LogicalType,_true> *)in_RDI;
}

Assistant:

vector<LogicalType> ColumnList::GetColumnTypes() const {
	vector<LogicalType> types;
	types.reserve(columns.size());
	for (auto &column : columns) {
		types.push_back(column.Type());
	}
	return types;
}